

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O2

void * lua_topointer(lua_State *L,int idx)

{
  TValue *pTVar1;
  GCObject *pGVar2;
  void *pvVar3;
  
  pTVar1 = index2adr(L,idx);
  pGVar2 = (GCObject *)0x0;
  switch(pTVar1->tt) {
  case 2:
  case 7:
    pvVar3 = lua_touserdata(L,idx);
    return pvVar3;
  case 5:
  case 6:
  case 8:
    pGVar2 = (pTVar1->value).gc;
  }
  return pGVar2;
}

Assistant:

LUA_API const void *lua_topointer (lua_State *L, int idx) {
  StkId o = index2adr(L, idx);
  switch (ttype(o)) {
    case LUA_TTABLE: return hvalue(o);
    case LUA_TFUNCTION: return clvalue(o);
    case LUA_TTHREAD: return thvalue(o);
    case LUA_TUSERDATA:
    case LUA_TLIGHTUSERDATA:
      return lua_touserdata(L, idx);
    default: return NULL;
  }
}